

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_frcp_df_mips64(CPUMIPSState_conflict5 *env,uint32_t df,uint32_t wd,uint32_t ws)

{
  int32_t *piVar1;
  float_status *pfVar2;
  fpr_t *pfVar3;
  byte bVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  float32 fVar8;
  float64 fVar9;
  uint uVar10;
  uint uVar11;
  float64 *pfVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  float_status *status_1;
  long lVar16;
  bool bVar17;
  bool bVar18;
  uint32_t unaff_retaddr;
  float_status *status;
  wr_t wx;
  float64 local_48;
  float64 afStack_40 [2];
  
  lVar5 = (ulong)ws * 0x10 + 0x338;
  piVar1 = &(env->active_tc).msacsr;
  *piVar1 = *piVar1 & 0xfffc0fff;
  if (df == 2) {
    pfVar2 = &(env->active_tc).msa_fp_status;
    lVar16 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar8 = float32_div_mips64(0x3f800000,
                                 *(float32 *)
                                  ((long)(env->active_fpu).fpr + lVar16 * 4 + lVar5 + -0x338),pfVar2
                                );
      *(float32 *)((long)afStack_40 + lVar16 * 4 + -8) = fVar8;
      bVar18 = true;
      if ((*(uint *)((long)(env->active_fpu).fpr + lVar16 * 4 + lVar5 + -0x338) & 0x7fffffff) !=
          0x7f800000) {
        iVar6 = float32_is_quiet_nan_mips64(fVar8,pfVar2);
        bVar18 = iVar6 != 0;
      }
      if ((fVar8 & 0x7fffffff) == 0) {
        uVar15 = (uint)(env->active_tc).msa_fp_status.float_exception_flags;
      }
      else {
        bVar4 = (env->active_tc).msa_fp_status.float_exception_flags;
        uVar15 = (uint)bVar4;
        if ((fVar8 & 0x7f800000) == 0) {
          uVar15 = bVar4 | 0x10;
        }
      }
      uVar7 = ieee_ex_to_mips_mips64(uVar15);
      uVar10 = (env->active_tc).msacsr;
      uVar14 = (uVar10 & 0x1000000) >> 0x18 & uVar15 >> 6;
      uVar11 = 3;
      if ((uVar10 & 0x1000000) == 0) {
        uVar11 = uVar14;
      }
      if (uVar15 < 0x80) {
        uVar11 = uVar14;
      }
      uVar11 = uVar11 | uVar7;
      uVar14 = (uint)((uVar10 >> 9 & 1) == 0 & (byte)uVar7 >> 2);
      uVar13 = uVar14 | uVar11;
      uVar15 = uVar7 & 0xfffffffc;
      if ((uVar14 != 0 || (uVar11 & 1) != 0) || (uVar10 & 0x100) != 0) {
        uVar15 = uVar13;
      }
      if ((uVar11 & 2) == 0) {
        uVar15 = uVar13;
      }
      uVar11 = 1;
      if ((uVar15 & 0x18) != 0) {
        uVar11 = uVar15;
      }
      if (bVar18) {
        uVar11 = uVar15;
      }
      if ((uVar11 & (uVar10 >> 7 & 0x1f | 0x20)) == 0) {
        uVar15 = uVar11 << 0xc;
LAB_008c28f6:
        (env->active_tc).msacsr = uVar15 & 0x3f000 | uVar10;
        if (((uVar10 >> 7 & 0x1f | 0x20) & uVar11) != 0) goto LAB_008c2911;
      }
      else {
        if ((uVar10 >> 0x12 & 1) == 0) {
          uVar15 = uVar11 << 0xc | uVar10;
          uVar10 = uVar10 & 0xfff80fff;
          goto LAB_008c28f6;
        }
LAB_008c2911:
        fVar8 = float32_default_nan_mips64(pfVar2);
        *(float32 *)((long)afStack_40 + lVar16 * 4 + -8) = fVar8 & 0xffffffc0 ^ 0x400000 | uVar11;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != 4);
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1ba7,
                    "void helper_msa_frcp_df_mips64(CPUMIPSState *, uint32_t, uint32_t, uint32_t)");
    }
    pfVar2 = &(env->active_tc).msa_fp_status;
    pfVar12 = &local_48;
    lVar16 = 0;
    bVar18 = true;
    do {
      bVar17 = bVar18;
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar9 = float64_div_mips64(0x3ff0000000000000,
                                 *(float64 *)
                                  ((long)(env->active_fpu).fpr + lVar16 * 8 + lVar5 + -0x338),pfVar2
                                );
      *pfVar12 = fVar9;
      bVar18 = true;
      if ((*(ulong *)((long)(env->active_fpu).fpr + lVar16 * 8 + lVar5 + -0x338) &
          0x7fffffffffffffff) != 0x7ff0000000000000) {
        iVar6 = float64_is_quiet_nan_mips64(fVar9,pfVar2);
        bVar18 = iVar6 != 0;
      }
      if ((fVar9 & 0x7fffffffffffffff) == 0) {
        uVar15 = (uint)(env->active_tc).msa_fp_status.float_exception_flags;
      }
      else {
        bVar4 = (env->active_tc).msa_fp_status.float_exception_flags;
        uVar15 = (uint)bVar4;
        if ((fVar9 & 0x7ff0000000000000) == 0) {
          uVar15 = bVar4 | 0x10;
        }
      }
      uVar7 = ieee_ex_to_mips_mips64(uVar15);
      uVar10 = (env->active_tc).msacsr;
      uVar14 = (uVar10 & 0x1000000) >> 0x18 & uVar15 >> 6;
      uVar11 = 3;
      if ((uVar10 & 0x1000000) == 0) {
        uVar11 = uVar14;
      }
      if (uVar15 < 0x80) {
        uVar11 = uVar14;
      }
      uVar11 = uVar11 | uVar7;
      uVar13 = (uint)((uVar10 >> 9 & 1) == 0 & (byte)uVar7 >> 2);
      uVar14 = uVar13 | uVar11;
      uVar15 = uVar7 & 0xfffffffc;
      if ((uVar13 != 0 || (uVar11 & 1) != 0) || (uVar10 & 0x100) != 0) {
        uVar15 = uVar14;
      }
      if ((uVar11 & 2) == 0) {
        uVar15 = uVar14;
      }
      uVar11 = 1;
      if ((uVar15 & 0x18) != 0) {
        uVar11 = uVar15;
      }
      if (bVar18) {
        uVar11 = uVar15;
      }
      if ((uVar11 & (uVar10 >> 7 & 0x1f | 0x20)) == 0) {
        uVar15 = uVar11 << 0xc;
LAB_008c2773:
        (env->active_tc).msacsr = uVar15 & 0x3f000 | uVar10;
        if (((uVar10 >> 7 & 0x1f | 0x20) & uVar11) != 0) goto LAB_008c278e;
      }
      else {
        if ((uVar10 >> 0x12 & 1) == 0) {
          uVar15 = uVar11 << 0xc | uVar10;
          uVar10 = uVar10 & 0xfff80fff;
          goto LAB_008c2773;
        }
LAB_008c278e:
        fVar9 = float64_default_nan_mips64(pfVar2);
        *pfVar12 = (long)(int)uVar11 | fVar9 & 0xffffffffffffffc0 ^ 0x8000000000000;
      }
      lVar16 = 1;
      pfVar12 = afStack_40;
      bVar18 = false;
    } while (bVar17);
  }
  uVar15 = (env->active_tc).msacsr;
  uVar10 = uVar15 >> 7 & 0x1f | 0x20;
  if ((uVar10 & uVar15 >> 0xc) != 0) {
    do_raise_exception(env,unaff_retaddr,(ulong)uVar10);
  }
  (env->active_tc).msacsr = (uVar15 >> 0xc & 0x1f) << 2 | uVar15;
  pfVar3 = (env->active_fpu).fpr + wd;
  pfVar3->fd = local_48;
  (&pfVar3->fd)[1] = afStack_40[0];
  return;
}

Assistant:

void helper_msa_frcp_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                        uint32_t ws)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    uint32_t i;

    clear_msacsr_cause(env);

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            MSA_FLOAT_RECIPROCAL(pwx->w[i], pws->w[i], 32);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_RECIPROCAL(pwx->d[i], pws->d[i], 64);
        }
        break;
    default:
        assert(0);
    }

    check_msacsr_cause(env, GETPC());

    msa_move_v(pwd, pwx);
}